

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O3

void cmSystemTools::Message(string *m,char *title)

{
  ostream *poVar1;
  
  if (!s_DisableMessages) {
    if ((anonymous_namespace)::s_MessageCallback_abi_cxx11_._16_8_ == 0) {
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(m->_M_dataplus)._M_p,m->_M_string_length);
      std::ios::widen((char)poVar1->_vptr_basic_ostream[-3] + (char)poVar1);
      std::ostream::put((char)poVar1);
      std::ostream::flush();
      std::ostream::flush();
      return;
    }
    (*(code *)(anonymous_namespace)::s_MessageCallback_abi_cxx11_._24_8_)
              ((anonymous_namespace)::s_MessageCallback_abi_cxx11_,m);
  }
  return;
}

Assistant:

void cmSystemTools::Message(const std::string& m, const char* title)
{
  if (s_DisableMessages) {
    return;
  }
  if (s_MessageCallback) {
    s_MessageCallback(m, title);
    return;
  }
  std::cerr << m << std::endl << std::flush;
}